

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O3

PyObject * libxml_xmlElementPtrWrap(xmlElementPtr elem)

{
  PyObject *pPVar1;
  
  if (elem != (xmlElementPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(elem,"xmlElementPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlElementPtrWrap(xmlElementPtr elem)
{
    PyObject *ret;

    if (elem == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) elem, (char *) "xmlElementPtr", NULL);
    return (ret);
}